

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O3

void * __thiscall henson::Array::void_ptr(Array *this)

{
  ulong uVar1;
  void *pvVar2;
  undefined1 local_9;
  undefined1 *local_8;
  
  uVar1 = (ulong)*(index_t *)
                  ((long)&(this->address).impl_.
                          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                          .
                          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                          .
                          super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>
                          .
                          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                          .
                          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                  + 8);
  if (uVar1 != 0xffffffff) {
    local_8 = &local_9;
    pvVar2 = (void *)(**(code **)(mpark::detail::visitation::
                                  fmatrix<mpark::detail::visitation::variant::value_visitor<henson::Array::get_void_ptr>&&,mpark::detail::base<(mpark::detail::Trait)0,void*,float*,double*,int*,long*>const&>
                                  ::value + uVar1 * 8))(&local_8,this);
    return pvVar2;
  }
  mpark::throw_bad_variant_access();
}

Assistant:

void*   void_ptr() const                    { return visit(get_void_ptr {}, address); }